

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allnodes.cpp
# Opt level: O0

int define_till_no_keyword
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *b,int i,datanode *node,int width)

{
  bool bVar1;
  reference pvVar2;
  size_type sVar3;
  long lVar4;
  string local_a0 [32];
  undefined4 local_80;
  string local_70 [8];
  string type;
  string local_50 [8];
  string IOWG;
  int width_local;
  datanode *node_local;
  int i_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *b_local;
  
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](b,(long)(i + -1));
  std::__cxx11::string::string(local_50,(string *)pvVar2);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](b,(long)i);
  std::__cxx11::string::string(local_70,(string *)pvVar2);
  node_local._4_4_ = i;
  while (sVar3 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::size(b), (ulong)(long)node_local._4_4_ < sVar3 - 5) {
    b_local._4_4_ = node_local._4_4_ + 1;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](b,(long)b_local._4_4_);
    bVar1 = std::operator==(pvVar2,"input");
    if (bVar1) goto LAB_00109b35;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](b,(long)b_local._4_4_);
    bVar1 = std::operator==(pvVar2,"output");
    if (bVar1) goto LAB_00109b35;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](b,(long)b_local._4_4_);
    bVar1 = std::operator==(pvVar2,"wire");
    if (bVar1) goto LAB_00109b35;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](b,(long)b_local._4_4_);
    bVar1 = std::operator==(pvVar2,"register");
    if (bVar1) goto LAB_00109b35;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](b,(long)(node_local._4_4_ + 2));
    bVar1 = std::operator==(pvVar2,"=");
    if (bVar1) goto LAB_00109b35;
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](b,(long)b_local._4_4_);
    lVar4 = std::__cxx11::string::find((char *)pvVar2,0x11409b);
    if (lVar4 == -1) {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](b,(long)b_local._4_4_);
      std::__cxx11::string::operator=((string *)(node + nodepointer),(string *)pvVar2);
    }
    else {
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](b,(long)b_local._4_4_);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](b,(long)b_local._4_4_);
      std::__cxx11::string::length();
      std::__cxx11::string::substr((ulong)local_a0,(ulong)pvVar2);
      std::__cxx11::string::operator=((string *)(node + nodepointer),local_a0);
      std::__cxx11::string::~string(local_a0);
    }
    std::__cxx11::string::operator=((string *)&node[nodepointer].typeofIOWG,local_50);
    std::__cxx11::string::operator=((string *)&node[nodepointer].type,local_70);
    node[nodepointer].width = width;
    node[nodepointer].delay = 0.0;
    nodepointer = nodepointer + 1;
    node_local._4_4_ = b_local._4_4_;
  }
  b_local._4_4_ = node_local._4_4_;
LAB_00109b35:
  local_80 = 1;
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  return b_local._4_4_;
}

Assistant:

int define_till_no_keyword(vector<string>&b, int i, struct datanode *node, int width) {

string IOWG = b[i - 1];
string type = b[i];
while (i < b.size()-5)
{
	i++;

			if (b[i] == "input" || b[i] == "output" || b[i] == "wire" || b[i] == "register" || b[i + 1] == "=")
			{
				return i;
			}
			else
			{
				if (b[i].find(",") != string::npos)
				{
					node[nodepointer].name = b[i].substr(0, b[i].length() - 1);
				}
				else
					node[nodepointer].name = b[i];
				
				node[nodepointer].typeofIOWG = IOWG;
				node[nodepointer].type = type;
				node[nodepointer].width = width;
				node[nodepointer].delay = 0.0;
				nodepointer++;
			}
			
}
return i;
}